

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O0

void __thiscall
TPZManVector<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>,_20>::Resize
          (TPZManVector<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>,_20> *this,int64_t newsize
          ,TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *object)

{
  undefined1 auVar1 [16];
  ostream *this_00;
  TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *pTVar2;
  ulong uVar3;
  ulong uVar4;
  ulong *puVar5;
  TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *pTVar6;
  long in_RSI;
  TPZManVector<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>,_20> *in_RDI;
  ulong uVar7;
  TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *newstore;
  int64_t realsize;
  int64_t i_2;
  int64_t i_1;
  int64_t i;
  TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *in_stack_ffffffffffffff10;
  TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *this_01;
  TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *in_stack_ffffffffffffff18;
  TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *pTVar8;
  TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *in_stack_ffffffffffffff20;
  TPZReference *pTVar9;
  TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *local_a8;
  long local_30;
  long local_28;
  long local_20;
  
  if (in_RSI < 0) {
    this_00 = std::operator<<((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::ostream::flush();
  }
  else if (in_RSI != (in_RDI->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).
                     fNElements) {
    if ((in_RDI->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fNAlloc < in_RSI)
    {
      if (in_RSI < 0x15) {
        for (local_28 = 0;
            local_28 <
            (in_RDI->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fNElements;
            local_28 = local_28 + 1) {
          TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>::operator=
                    (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
        }
        for (; local_28 < in_RSI; local_28 = local_28 + 1) {
          TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>::operator=
                    (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
        }
        if (((in_RDI->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fStore !=
             in_RDI->fExtAlloc) &&
           (pTVar6 = (in_RDI->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).
                     fStore, pTVar6 != (TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *)0x0)) {
          pTVar9 = pTVar6[-1].fRef;
          for (pTVar2 = pTVar6 + (long)pTVar9; pTVar6 != pTVar2; pTVar2 = pTVar2 + -1) {
            TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>::~TPZAutoPointer
                      (in_stack_ffffffffffffff10);
          }
          operator_delete__(pTVar6 + -1,(long)pTVar9 * 8 + 8);
        }
        (in_RDI->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fStore =
             in_RDI->fExtAlloc;
        (in_RDI->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fNElements =
             in_RSI;
        (in_RDI->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fNAlloc = 0x14;
      }
      else {
        uVar3 = ExpandSize(in_RDI,in_RSI);
        auVar1._8_8_ = 0;
        auVar1._0_8_ = uVar3;
        uVar4 = SUB168(auVar1 * ZEXT816(8),0);
        uVar7 = uVar4 + 8;
        if (SUB168(auVar1 * ZEXT816(8),8) != 0 || 0xfffffffffffffff7 < uVar4) {
          uVar7 = 0xffffffffffffffff;
        }
        puVar5 = (ulong *)operator_new__(uVar7);
        *puVar5 = uVar3;
        pTVar6 = (TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *)(puVar5 + 1);
        if (uVar3 != 0) {
          local_a8 = pTVar6;
          do {
            TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>::TPZAutoPointer
                      (in_stack_ffffffffffffff20);
            local_a8 = local_a8 + 1;
          } while (local_a8 != pTVar6 + uVar3);
        }
        for (local_30 = 0;
            local_30 <
            (in_RDI->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fNElements;
            local_30 = local_30 + 1) {
          TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>::operator=
                    (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
        }
        for (; local_30 < in_RSI; local_30 = local_30 + 1) {
          TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>::operator=
                    (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
        }
        if (((in_RDI->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fStore !=
             in_RDI->fExtAlloc) &&
           (pTVar2 = (in_RDI->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).
                     fStore, pTVar2 != (TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *)0x0)) {
          pTVar8 = pTVar2 + -1;
          pTVar9 = pTVar2[-1].fRef;
          this_01 = pTVar2 + (long)pTVar9;
          while (pTVar2 != this_01) {
            this_01 = this_01 + -1;
            TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>::~TPZAutoPointer(this_01);
          }
          operator_delete__(pTVar8,(long)pTVar9 * 8 + 8);
        }
        (in_RDI->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fStore = pTVar6;
        (in_RDI->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fNElements =
             in_RSI;
        (in_RDI->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fNAlloc = uVar3;
      }
    }
    else {
      for (local_20 = (in_RDI->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).
                      fNElements; local_20 < in_RSI; local_20 = local_20 + 1) {
        TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>::operator=
                  (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
      }
      (in_RDI->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>_>).fNElements = in_RSI
      ;
    }
  }
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize, const T& object) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
    if (newsize == this->fNElements)
        return;
#endif

    if (newsize <= this->fNAlloc) {
        for (int64_t i = this->fNElements; i < newsize; i++)
            this->fStore[i] = object;

        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore. Moreover : this->fNElements <= this->fNAlloc
        // <= NumExtAlloc

        int64_t i;

        for (i = 0L; i < this->fNElements; i++) {
            fExtAlloc[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            fExtAlloc[i] = object;

        if (this->fStore != fExtAlloc) delete [] this->fStore;

        this->fStore = fExtAlloc;
        this->fNElements = newsize;
        this->fNAlloc = NumExtAlloc;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs
        int64_t i, realsize = ExpandSize(newsize);

        T* newstore = new T[realsize];

        for (i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            newstore[i] = object;

        if (this->fStore != fExtAlloc)
            delete[]this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}